

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::BatchedMatMulLayerParams::ByteSizeLong(BatchedMatMulLayerParams *this)

{
  bool bVar1;
  int iVar2;
  uint64 uVar3;
  size_t sVar4;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  BatchedMatMulLayerParams *this_local;
  
  sStack_18 = 0;
  bVar1 = has_weights(this);
  if (bVar1) {
    sStack_18 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->weights_);
    sStack_18 = sStack_18 + 1;
  }
  bVar1 = has_bias(this);
  if (bVar1) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->bias_);
    sStack_18 = sVar4 + 1 + sStack_18;
  }
  uVar3 = weightmatrixfirstdimension(this);
  if (uVar3 != 0) {
    uVar3 = weightmatrixfirstdimension(this);
    sVar4 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar3);
    sStack_18 = sVar4 + 1 + sStack_18;
  }
  uVar3 = weightmatrixseconddimension(this);
  if (uVar3 != 0) {
    uVar3 = weightmatrixseconddimension(this);
    sVar4 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar3);
    sStack_18 = sVar4 + 1 + sStack_18;
  }
  bVar1 = transposea(this);
  if (bVar1) {
    sStack_18 = sStack_18 + 2;
  }
  bVar1 = transposeb(this);
  if (bVar1) {
    sStack_18 = sStack_18 + 2;
  }
  bVar1 = hasbias(this);
  if (bVar1) {
    sStack_18 = sStack_18 + 2;
  }
  bVar1 = int8dynamicquantize(this);
  if (bVar1) {
    sStack_18 = sStack_18 + 2;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t BatchedMatMulLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BatchedMatMulLayerParams)
  size_t total_size = 0;

  // .CoreML.Specification.WeightParams weights = 8;
  if (this->has_weights()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->weights_);
  }

  // .CoreML.Specification.WeightParams bias = 9;
  if (this->has_bias()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->bias_);
  }

  // uint64 weightMatrixFirstDimension = 5;
  if (this->weightmatrixfirstdimension() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->weightmatrixfirstdimension());
  }

  // uint64 weightMatrixSecondDimension = 6;
  if (this->weightmatrixseconddimension() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->weightmatrixseconddimension());
  }

  // bool transposeA = 1;
  if (this->transposea() != 0) {
    total_size += 1 + 1;
  }

  // bool transposeB = 2;
  if (this->transposeb() != 0) {
    total_size += 1 + 1;
  }

  // bool hasBias = 7;
  if (this->hasbias() != 0) {
    total_size += 1 + 1;
  }

  // bool int8DynamicQuantize = 10;
  if (this->int8dynamicquantize() != 0) {
    total_size += 1 + 1;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}